

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::TestDynamicStructHandler::decode
          (TestDynamicStructHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader input_00;
  Field field;
  StructSchema SVar1;
  BuilderArena *pBVar2;
  CapTableBuilder *pCVar3;
  int iVar4;
  Type index;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Type type;
  Orphanage orphanage;
  StructBuilder inner;
  Reader item;
  FieldList fields;
  Reader items;
  undefined1 local_1b0 [24];
  bool local_198 [8];
  SegmentBuilder *local_190;
  undefined1 local_178 [12];
  undefined4 uStack_16c;
  StructReader local_168;
  StructReader local_138;
  SegmentReader *local_108;
  CapTableReader *pCStack_100;
  short *local_f8;
  WirePointer *pWStack_f0;
  undefined8 local_e8;
  int iStack_e0;
  undefined4 uStack_dc;
  SegmentBuilder *local_d8;
  CapTableReader *pCStack_d0;
  SegmentReader *local_c8;
  WirePointer *pWStack_c0;
  void *local_b8;
  WirePointer *pWStack_b0;
  StructDataBitCount local_a8;
  StructPointerCount SStack_a4;
  undefined2 uStack_a2;
  int iStack_a0;
  undefined4 uStack_9c;
  FieldList local_98;
  ListReader local_60;
  
  local_168.data = (void *)output.builder._32_8_;
  local_168.segment = (SegmentReader *)output.builder.data;
  local_168.capTable = (CapTableReader *)output.builder.pointers;
  local_178._0_8_ = output.builder.segment;
  stack0xfffffffffffffe90 = &(output.builder.capTable)->super_CapTableReader;
  pBVar2 = StructBuilder::getArena((StructBuilder *)local_178);
  pCVar3 = StructBuilder::getCapTable((StructBuilder *)local_178);
  local_178._0_8_ = output.schema.super_Schema.raw;
  StructSchema::getFields(&local_98,(StructSchema *)local_178);
  bVar5 = input._reader.pointerCount == 0;
  local_168.segment = (SegmentReader *)input._reader.pointers;
  if (bVar5) {
    local_168.segment = (SegmentReader *)0x0;
  }
  iVar4 = 0x7fffffff;
  if (!bVar5) {
    iVar4 = input._reader.nestingLimit;
  }
  local_178._0_4_ = 0;
  local_178._4_4_ = 0;
  uVar6 = 0;
  uVar7 = 0;
  if (!bVar5) {
    local_178._0_4_ = input._reader.segment._0_4_;
    local_178._4_4_ = input._reader.segment._4_4_;
    uVar6 = input._reader.capTable._0_4_;
    uVar7 = input._reader.capTable._4_4_;
  }
  stack0xfffffffffffffe90 = (CapTableReader *)CONCAT44(uVar7,uVar6);
  local_168.capTable = (CapTableReader *)CONCAT44(local_168.capTable._4_4_,iVar4);
  PointerReader::getList(&local_60,(PointerReader *)local_178,INLINE_COMPOSITE,(word *)0x0);
  if (local_98.list.reader.elementCount != UNKNOWN) {
    index = UNKNOWN;
    do {
      SVar1.super_Schema.raw = (Schema)(Schema)local_98.parent;
      ListReader::getStructElement(&local_168,&local_98.list.reader,index);
      local_178._0_8_ = SVar1.super_Schema.raw;
      stack0xfffffffffffffe90 = (CapTableReader *)CONCAT44(uStack_16c,index);
      local_1b0._4_4_ = local_60.elementCount;
      local_1b0._8_8_ = " < ";
      local_1b0._16_8_ = (anon_union_8_2_eba6ea51_for_Type_5)0x4;
      local_198[0] = index < local_60.elementCount;
      local_1b0._0_4_ = index;
      if (!local_198[0]) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&>
                  ((Fault *)&local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
                   ,0x2ea,FAILED,"field.getIndex() < items.size()","_kjCondition,",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_1b0);
        kj::_::Debug::Fault::fatal((Fault *)&local_138);
      }
      ListReader::getStructElement(&local_138,&local_60,index);
      if ((0xf < local_138.dataSize) && (*local_138.data != 0)) {
        local_a8 = local_168.dataSize;
        SStack_a4 = local_168.pointerCount;
        uStack_a2 = local_168._38_2_;
        iStack_a0 = local_168.nestingLimit;
        uStack_9c = local_168._44_4_;
        local_b8 = local_168.data;
        pWStack_b0 = local_168.pointers;
        local_c8 = local_168.segment;
        pWStack_c0 = (WirePointer *)local_168.capTable;
        local_d8 = (SegmentBuilder *)local_178._0_8_;
        pCStack_d0 = stack0xfffffffffffffe90;
        local_e8 = CONCAT44(local_138._36_4_,local_138.dataSize);
        local_108 = local_138.segment;
        pCStack_100 = local_138.capTable;
        local_f8 = (short *)local_138.data;
        pWStack_f0 = local_138.pointers;
        iStack_e0 = local_138.nestingLimit;
        uStack_dc = local_138._44_4_;
        type = StructSchema::Field::getType((Field *)local_178);
        input_00._reader.capTable = pCStack_100;
        input_00._reader.segment = local_108;
        input_00._reader.data = local_f8;
        input_00._reader.pointers = pWStack_f0;
        input_00._reader.dataSize = (undefined4)local_e8;
        input_00._reader.pointerCount = local_e8._4_2_;
        input_00._reader._38_2_ = local_e8._6_2_;
        input_00._reader.nestingLimit = iStack_e0;
        input_00._reader._44_4_ = uStack_dc;
        orphanage.capTable = pCVar3;
        orphanage.arena = pBVar2;
        JsonCodec::decode((Orphan<capnp::DynamicValue> *)local_1b0,codec,input_00,type,orphanage);
        field._8_8_ = pCStack_d0;
        field.parent.super_Schema.raw = (Schema)(Schema)local_d8;
        field.proto._reader.segment = local_c8;
        field.proto._reader.capTable = (CapTableReader *)pWStack_c0;
        field.proto._reader.data = local_b8;
        field.proto._reader.pointers = pWStack_b0;
        field.proto._reader.dataSize = local_a8;
        field.proto._reader.pointerCount = SStack_a4;
        field.proto._reader._38_2_ = uStack_a2;
        field.proto._reader.nestingLimit = iStack_a0;
        field.proto._reader._44_4_ = uStack_9c;
        DynamicStruct::Builder::adopt(&output,field,(Orphan<capnp::DynamicValue> *)local_1b0);
        if (local_190 != (SegmentBuilder *)0x0) {
          OrphanBuilder::euthanize((OrphanBuilder *)local_198);
        }
      }
      index = index + VOID;
    } while (local_98.list.reader.elementCount != index);
  }
  return;
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    auto orphanage = Orphanage::getForMessageContaining(output);
    auto fields = output.getSchema().getFields();
    auto items = input.getArray();
    for (auto field: fields) {
      KJ_REQUIRE(field.getIndex() < items.size());
      auto item = items[field.getIndex()];
      if (!item.isNull()) {
        output.adopt(field, codec.decode(item, field.getType(), orphanage));
      }
    }
  }